

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

bool bech32::anon_unknown_0::CheckCharacters(string *str,vector<int,_std::allocator<int>_> *errors)

{
  char cVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (str->_M_string_length != 0) {
    bVar6 = false;
    uVar5 = 0;
    bVar3 = false;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar5];
      iVar4 = (int)uVar5;
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        if (bVar3) {
          iVar2._M_current =
               (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_3c = iVar4;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(errors,iVar2,&local_3c);
          }
          else {
            *iVar2._M_current = iVar4;
            (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
            local_3c = iVar4;
          }
          bVar3 = true;
        }
        else {
          bVar6 = true;
          bVar3 = false;
        }
      }
      else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        if (bVar6) {
          iVar2._M_current =
               (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_3c = iVar4;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(errors,iVar2,&local_3c);
          }
          else {
            *iVar2._M_current = iVar4;
            (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
            local_3c = iVar4;
          }
          bVar6 = true;
        }
        else {
          bVar3 = true;
          bVar6 = false;
        }
      }
      else if ((byte)(cVar1 + 0x81U) < 0xa2) {
        iVar2._M_current =
             (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar2._M_current ==
            (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          local_3c = iVar4;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(errors,iVar2,&local_3c);
        }
        else {
          *iVar2._M_current = iVar4;
          (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
          local_3c = iVar4;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < str->_M_string_length);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start ==
           (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckCharacters(const std::string& str, std::vector<int>& errors)
{
    bool lower = false, upper = false;
    for (size_t i = 0; i < str.size(); ++i) {
        unsigned char c{(unsigned char)(str[i])};
        if (c >= 'a' && c <= 'z') {
            if (upper) {
                errors.push_back(i);
            } else {
                lower = true;
            }
        } else if (c >= 'A' && c <= 'Z') {
            if (lower) {
                errors.push_back(i);
            } else {
                upper = true;
            }
        } else if (c < 33 || c > 126) {
            errors.push_back(i);
        }
    }
    return errors.empty();
}